

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

bool __thiscall
helics::InputInfo::addSource
          (InputInfo *this,GlobalHandle newSource,string_view sourceName,string_view stype,
          string_view sunits)

{
  bool bVar1;
  reference pvVar2;
  vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
  *this_00;
  undefined8 in_RSI;
  long in_RDI;
  GlobalHandle *is;
  iterator __end1;
  iterator __begin1;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__range1;
  int index;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  GlobalHandle in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  value_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
  *this_01;
  int local_94;
  TimeRepresentation<count_time<9,_long>_> local_90;
  pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int> local_88;
  baseType local_78;
  TimeRepresentation<count_time<9,_long>_> local_70;
  undefined8 local_68;
  reference local_60;
  GlobalHandle *local_58;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  local_50;
  long local_48;
  int local_3c;
  undefined8 local_c;
  
  this_01 = (vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
             *)&stack0x00000008;
  local_3c = 0;
  local_48 = in_RDI + 0xb0;
  local_c = in_RSI;
  local_50._M_current =
       (GlobalHandle *)
       std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                 ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                  in_stack_ffffffffffffff18);
  local_58 = (GlobalHandle *)
             std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
                       ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                        in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                      ((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                        *)in_stack_ffffffffffffff18);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4e5e74);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4e5e85);
      std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::push_back
                ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                 in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
      std::
      vector<helics::InputInfo::sourceInformation,std::allocator<helics::InputInfo::sourceInformation>>
      ::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                  *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
      this_00 = (vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                 *)(in_RDI + 0x110);
      std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                 (in_RDI + 0xb0));
      std::
      vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
      ::resize((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                 (in_RDI + 0xb0));
      std::
      vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
      ::resize((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                 (in_RDI + 0xb0));
      local_90 = TimeRepresentation<count_time<9,_long>_>::minVal();
      local_94 = 0;
      std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>::
      pair<TimeRepresentation<count_time<9,_long>_>,_int,_true>(&local_88,&local_90,&local_94);
      std::
      vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
      ::resize(this_01,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      TimeRepresentation<count_time<9,_long>_>::maxVal();
      std::
      vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
      ::push_back(this_00,(value_type *)in_stack_ffffffffffffff18);
      *(undefined1 *)(in_RDI + 0x6a) = 1;
      return true;
    }
    local_60 = __gnu_cxx::
               __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
               ::operator*(&local_50);
    local_68 = local_c;
    bVar1 = GlobalHandle::operator==
                      ((GlobalHandle *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
    if (bVar1) break;
    local_3c = local_3c + 1;
    __gnu_cxx::
    __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
    ::operator++(&local_50);
  }
  pvVar2 = std::
           vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
           ::operator[]((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                         *)(in_RDI + 200),(long)local_3c);
  local_70 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(pvVar2,&local_70);
  if (!bVar1) {
    return false;
  }
  local_78 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
  pvVar2 = std::
           vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
           ::operator[]((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                         *)(in_RDI + 200),(long)local_3c);
  pvVar2->internalTimeCode = local_78;
  std::
  vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
  ::operator[]((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                *)(in_RDI + 0xe0),(long)local_3c);
  std::__cxx11::string::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::
  vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
  ::operator[]((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                *)(in_RDI + 0xe0),(long)local_3c);
  std::__cxx11::string::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  return true;
}

Assistant:

bool InputInfo::addSource(GlobalHandle newSource,
                          std::string_view sourceName,
                          std::string_view stype,
                          std::string_view sunits)
{
    int index{0};
    for (const auto& is : input_sources) {
        if (is == newSource) {
            if (deactivated[index] < Time::maxVal()) {
                // this is a reconnection
                deactivated[index] = Time::maxVal();
                source_info[index].units = sunits;
                source_info[index].type = sunits;
                return true;
            }
            return false;
        }
        ++index;
    }
    // clear this since it isn't well defined what the units are once a new source is added
    inputUnits.clear();
    inputType.clear();
    input_sources.push_back(newSource);
    source_info.emplace_back(sourceName, stype, sunits);
    data_queues.resize(input_sources.size());
    current_data.resize(input_sources.size());
    current_data_time.resize(input_sources.size(), {Time::minVal(), 0});
    deactivated.push_back(Time::maxVal());
    has_target = true;
    return true;
}